

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

int AF_AActor_A_PlayerScream
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *actor;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  FSoundID *sound_id;
  int channel;
  char *__assertion;
  uint uVar4;
  bool bVar5;
  FSoundID local_30;
  FSoundID local_2c;
  FSoundID local_28;
  FSoundID local_24;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      actor = *(AActor **)&param->field_0;
      if (actor != (AActor *)0x0) {
        if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (actor->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0046da44;
        }
      }
      if ((actor->player == (player_t *)0x0) || ((actor->DeathSound).super_FSoundID.ID != 0)) {
        iVar2 = (actor->DeathSound).super_FSoundID.ID;
        if (iVar2 == 0) {
          iVar2 = S_FindSound("*death");
          sound_id = &local_28;
        }
        else {
          sound_id = &local_24;
        }
        sound_id->ID = iVar2;
        channel = 2;
      }
      else {
        channel = 2;
        iVar2 = 0;
        if ((((level.flags >> 0xf | dmflags.Value) & 0x18) != 0) &&
           (iVar2 = 0, (actor->Vel).Z <= -39.0)) {
          local_2c.ID = S_FindSound("*splat");
          iVar2 = S_FindSkinnedSound(actor,&local_2c);
          channel = 4;
        }
        if ((iVar2 == 0) && (iVar2 = 0, actor->special1 < 10)) {
          iVar2 = S_FindSkinnedSoundEx
                            (actor,"*wimpydeath",
                             FName::NameData.NameArray[(actor->player->LastDamageType).Index].Text);
        }
        if (iVar2 == 0) {
          iVar2 = 0;
          if (actor->health < -0x31) {
            iVar2 = 0;
            if (-100 < actor->health) {
              iVar2 = S_FindSkinnedSoundEx
                                (actor,"*crazydeath",
                                 FName::NameData.NameArray[(actor->player->LastDamageType).Index].
                                 Text);
            }
            if (iVar2 == 0) {
              iVar2 = S_FindSkinnedSoundEx
                                (actor,"*xdeath",
                                 FName::NameData.NameArray[(actor->player->LastDamageType).Index].
                                 Text);
              if (iVar2 == 0) {
                iVar2 = S_FindSkinnedSoundEx
                                  (actor,"*gibbed",
                                   FName::NameData.NameArray[(actor->player->LastDamageType).Index].
                                   Text);
                channel = 4;
              }
            }
          }
        }
        if (iVar2 == 0) {
          iVar2 = S_FindSkinnedSoundEx
                            (actor,"*death",
                             FName::NameData.NameArray[(actor->player->LastDamageType).Index].Text);
        }
        if (channel != 2) {
          uVar4 = 0xfffffffd;
          do {
            if (uVar4 < 0xfffffffe) {
              S_StopSound(actor,uVar4 + 3);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != 5);
        }
        sound_id = &local_30;
        local_30.ID = iVar2;
      }
      S_Sound(actor,channel,sound_id,1.0,1.0);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0046da44:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x641,
                "int AF_AActor_A_PlayerScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PlayerScream)
{
	PARAM_SELF_PROLOGUE(AActor);

	int sound = 0;
	int chan = CHAN_VOICE;

	if (self->player == NULL || self->DeathSound != 0)
	{
		if (self->DeathSound != 0)
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, "*death", 1, ATTN_NORM);
		}
		return 0;
	}

	// Handle the different player death screams
	if ((((level.flags >> 15) | (dmflags)) &
		(DF_FORCE_FALLINGZD | DF_FORCE_FALLINGHX)) &&
		self->Vel.Z <= -39)
	{
		sound = S_FindSkinnedSound (self, "*splat");
		chan = CHAN_BODY;
	}

	if (!sound && self->special1<10)
	{ // Wimpy death sound
		sound = S_FindSkinnedSoundEx (self, "*wimpydeath", self->player->LastDamageType);
	}
	if (!sound && self->health <= -50)
	{
		if (self->health > -100)
		{ // Crazy death sound
			sound = S_FindSkinnedSoundEx (self, "*crazydeath", self->player->LastDamageType);
		}
		if (!sound)
		{ // Extreme death sound
			sound = S_FindSkinnedSoundEx (self, "*xdeath", self->player->LastDamageType);
			if (!sound)
			{
				sound = S_FindSkinnedSoundEx (self, "*gibbed", self->player->LastDamageType);
				chan = CHAN_BODY;
			}
		}
	}
	if (!sound)
	{ // Normal death sound
		sound = S_FindSkinnedSoundEx (self, "*death", self->player->LastDamageType);
	}

	if (chan != CHAN_VOICE)
	{
		for (int i = 0; i < 8; ++i)
		{ // Stop most playing sounds from this player.
		  // This is mainly to stop *land from messing up *splat.
			if (i != CHAN_WEAPON && i != CHAN_VOICE)
			{
				S_StopSound (self, i);
			}
		}
	}
	S_Sound (self, chan, sound, 1, ATTN_NORM);
	return 0;
}